

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-store.c
# Opt level: O3

_Bool store_purchase(store_context *ctx,wchar_t item,_Bool single)

{
  byte bVar1;
  store *store;
  object *obj;
  _Bool _Var2;
  wchar_t wVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  object *dest;
  char *pcVar7;
  command_conflict *pcVar8;
  undefined7 in_register_00000011;
  cmd_code c;
  char *pcVar9;
  char o_name [80];
  object *local_90;
  char local_88 [88];
  
  store = ctx->store;
  obj = ctx->list[item];
  msg_flag = false;
  pcVar9 = "";
  prt("",L'\0',L'\0');
  _Var2 = store_is_home(store);
  if ((int)CONCAT71(in_register_00000011,single) != 0) {
    wVar4 = L'\x01';
    if ((_Var2) || (wVar6 = player->au, wVar3 = price_item(store,obj,false,L'\x01'), wVar3 <= wVar6)
       ) goto LAB_002072a2;
LAB_00207189:
    pcVar9 = "You do not have enough gold for this item.";
    goto LAB_00207190;
  }
  if (_Var2) {
    wVar6 = (uint)obj->number;
  }
  else {
    wVar6 = price_item(store,obj,false,L'\x01');
    wVar4 = player->au;
    if ((uint)wVar4 < (uint)wVar6) goto LAB_00207189;
    if (wVar6 == L'\0') {
      bVar1 = obj->number;
      wVar6 = (wchar_t)bVar1;
    }
    else {
      wVar6 = wVar4 / wVar6;
      bVar1 = obj->number;
    }
    wVar3 = (uint)bVar1;
    if (wVar6 < (int)(uint)bVar1) {
      wVar3 = wVar6;
    }
    wVar5 = price_item(store,obj,false,wVar3 + L'\x01');
    wVar6 = wVar3;
    if ((wVar5 <= wVar4) && (wVar6 = wVar3 + L'\x01', (int)(uint)obj->number <= wVar3)) {
      wVar6 = wVar3;
    }
  }
  wVar4 = inven_carry_num(player,obj);
  if (wVar4 < wVar6) {
    wVar6 = inven_carry_num(player,obj);
  }
  _Var2 = object_flavor_is_aware(obj);
  if (L'\0' < wVar6) {
    if (_Var2) {
LAB_002071c5:
      wVar4 = find_inven(obj);
      _Var2 = store_is_home(store);
      pcVar7 = "Buy";
      if (_Var2) {
        pcVar7 = "Take";
      }
      if (wVar4 != L'\0') {
        pcVar9 = format(" (you have %d)",(ulong)(uint)wVar4);
      }
    }
    else {
      _Var2 = store_is_home(store);
      if ((!_Var2) && (_Var2 = pack_is_full(), _Var2)) goto LAB_0020715b;
      _Var2 = store_is_home(store);
      if (_Var2) goto LAB_002071c5;
      _Var2 = store_is_home(store);
      pcVar7 = "Buy";
      if (_Var2) {
        pcVar7 = "Take";
      }
    }
    strnfmt(local_88,0x50,"%s how many%s? (max %d) ",pcVar7,pcVar9,(ulong)(uint)wVar6);
    wVar4 = get_quantity(local_88,wVar6);
    if (wVar4 < L'\x01') {
      return false;
    }
LAB_002072a2:
    dest = object_new();
    local_90 = dest;
    object_copy_amt(dest,obj,wVar4);
    _Var2 = inven_carry_okay(dest);
    if (_Var2) {
      _Var2 = store_is_home(store);
      if (_Var2) {
        c = CMD_RETRIEVE;
      }
      else {
        _Var2 = tval_is_book_k(obj->kind);
        if (_Var2) {
          _Var2 = obj_can_browse(obj);
          pcVar9 = " (Can\'t use!)";
          if (_Var2) {
            pcVar9 = "";
          }
        }
        else {
          pcVar9 = "";
        }
        object_desc(local_88,0x50,local_90,0x47,player);
        wVar6 = price_item(store,local_90,false,(uint)local_90->number);
        screen_save();
        pcVar7 = format("Price: %ld",(long)wVar6);
        prt(pcVar7,L'\x01',L'\0');
        pcVar9 = format("Buy %s?%s %s",local_88,pcVar9,"[ESC, any other key to accept]");
        _Var2 = store_get_check(pcVar9);
        screen_load();
        if (!_Var2) {
          return false;
        }
        c = CMD_BUY;
      }
      cmdq_push(c);
      pcVar8 = cmdq_peek();
      cmd_set_arg_item(pcVar8,"item",obj);
      pcVar8 = cmdq_peek();
      cmd_set_arg_number(pcVar8,"quantity",wVar4);
      *(byte *)&ctx->flags = (byte)ctx->flags | 1;
      object_delete((chunk *)0x0,(chunk *)0x0,&local_90);
      _Var2 = true;
    }
    else {
      _Var2 = false;
      msg("You cannot carry that many items.");
      object_delete((chunk *)0x0,(chunk *)0x0,&local_90);
    }
    return _Var2;
  }
LAB_0020715b:
  pcVar9 = "You cannot carry that many items.";
LAB_00207190:
  msg(pcVar9);
  return false;
}

Assistant:

static bool store_purchase(struct store_context *ctx, int item, bool single)
{
	struct store *store = ctx->store;

	struct object *obj = ctx->list[item];
	struct object *dummy = NULL;

	char o_name[80];

	int amt, num;

	int32_t price;

	/* Clear all current messages */
	msg_flag = false;
	prt("", 0, 0);


	/*** Check the player can get any at all ***/

	/* Get an amount if we weren't given one */
	if (single) {
		amt = 1;

		/* Check if the player can afford any at all */
		if (!store_is_home(store) &&
				player->au < price_item(store, obj, false, 1)) {
			msg("You do not have enough gold for this item.");
			return false;
		}
	} else {
		bool flavor_aware;

		if (store_is_home(store)) {
			amt = obj->number;
		} else {
			/* Price of one */
			price = price_item(store, obj, false, 1);

			/* Check if the player can afford any at all */
			if ((uint32_t)player->au < (uint32_t)price) {
				msg("You do not have enough gold for this item.");
				return false;
			}

			/* Work out how many the player can afford */
			if (price == 0)
				amt = obj->number; /* Prevent division by zero */
			else
				amt = player->au / price;

			if (amt > obj->number) amt = obj->number;

			/* Double check for wands/staves */
			if ((player->au >= price_item(store, obj, false, amt+1)) &&
				(amt < obj->number))
				amt++;
		}

		/* Limit to the number that can be carried */
		amt = MIN(amt, inven_carry_num(player, obj));

		/* Fail if there is no room.  Don't leak information about
		 * unknown flavors for a purchase (getting it from home doesn't
		 * leak information since it doesn't show the true flavor). */
		flavor_aware = object_flavor_is_aware(obj);
		if (amt <= 0 || (!flavor_aware && !store_is_home(store) &&
						 pack_is_full())) {
			msg("You cannot carry that many items.");
			return false;
		}

		/* Find the number of this item in the inventory.  As above,
		 * avoid leaking information about unknown flavors. */
		if (!flavor_aware && !store_is_home(store))
			num = 0;
		else
			num = find_inven(obj);

		strnfmt(o_name, sizeof o_name, "%s how many%s? (max %d) ",
				(store_is_home(store)) ? "Take" : "Buy",
				num ? format(" (you have %d)", num) : "", amt);

		/* Get a quantity */
		amt = get_quantity(o_name, amt);

		/* Allow user abort */
		if (amt <= 0) return false;
	}

	/* Get desired object */
	dummy = object_new();
	object_copy_amt(dummy, obj, amt);

	/* Ensure we have room */
	if (!inven_carry_okay(dummy)) {
		msg("You cannot carry that many items.");
		object_delete(NULL, NULL, &dummy);
		return false;
	}

	/* Attempt to buy it */
	if (!store_is_home(store)) {
		bool response;

		bool obj_is_book = tval_is_book_k(obj->kind);
		bool obj_can_use = !obj_is_book || obj_can_browse(obj);

		/* Describe the object (fully) */
		object_desc(o_name, sizeof(o_name), dummy,
			ODESC_PREFIX | ODESC_FULL | ODESC_STORE, player);

		/* Extract the price for the entire stack */
		price = price_item(store, dummy, false, dummy->number);

		screen_save();

		/* Show price */
		prt(format("Price: %ld", (long)price), 1, 0);

		/* Confirm purchase */
		response = store_get_check(format("Buy %s?%s %s",
					o_name,
					obj_can_use ? "" : " (Can't use!)",
					"[ESC, any other key to accept]"));

		screen_load();

		/* Negative response, so give up */
		if (!response) return false;

		cmdq_push(CMD_BUY);
		cmd_set_arg_item(cmdq_peek(), "item", obj);
		cmd_set_arg_number(cmdq_peek(), "quantity", amt);
	} else {
		/* Home is much easier */
		cmdq_push(CMD_RETRIEVE);
		cmd_set_arg_item(cmdq_peek(), "item", obj);
		cmd_set_arg_number(cmdq_peek(), "quantity", amt);
	}

	/* Update the display */
	ctx->flags |= STORE_GOLD_CHANGE;

	object_delete(NULL, NULL, &dummy);

	/* Not kicked out */
	return true;
}